

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingBox.h
# Opt level: O2

void __thiscall vera::BoundingBox::square(BoundingBox *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  vec3 vVar6;
  vec3 vVar7;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_18;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_14;
  
  vVar6 = getCenter(this);
  vVar7 = getDiagonal(this);
  uVar2 = (uint)(vVar7.field_0.x * 0.5);
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar3 = (uint)(vVar7.field_1.y * 0.5);
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar4 = (uint)(vVar7.field_2.z * 0.5);
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if (uVar3 < uVar2) {
    uVar3 = uVar2;
  }
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  fVar5 = (float)(int)uVar3;
  local_18 = vVar6.field_0;
  aStack_14 = vVar6.field_1;
  (this->max).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(local_18.x + fVar5);
  (this->max).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(aStack_14.y + fVar5);
  (this->max).field_2.z = vVar6.field_2.z + fVar5;
  (this->min).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(local_18.x - fVar5);
  (this->min).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(aStack_14.y - fVar5);
  (this->min).field_2.z = vVar6.field_2.z - fVar5;
  return;
}

Assistant:

void        square() {
        glm::vec3   center  = getCenter();
        glm::vec3   diag    = getDiagonal() * 0.5f;
        float       mmax    = glm::max( abs(diag.x), glm::max( abs(diag.y), abs(diag.z) ) );
        max                 = center + mmax;
        min                 = center - mmax;
    }